

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp_solver.cc
# Opt level: O3

Int __thiscall ipx::LpSolver::GetBasis(LpSolver *this,Int *cbasis,Int *vbasis)

{
  Basis *this_00;
  long lVar1;
  double *pdVar2;
  double *pdVar3;
  Int IVar4;
  Model *pMVar5;
  ulong __n;
  ulong uVar6;
  vector<int,_std::allocator<int>_> basic_statuses;
  allocator_type local_49;
  vector<int,_std::allocator<int>_> local_48;
  
  this_00 = (this->basis_)._M_t.super___uniq_ptr_impl<ipx::Basis,_std::default_delete<ipx::Basis>_>.
            _M_t.super__Tuple_impl<0UL,_ipx::Basis_*,_std::default_delete<ipx::Basis>_>.
            super__Head_base<0UL,_ipx::Basis_*,_false>._M_head_impl;
  if (this_00 == (Basis *)0x0) {
    IVar4 = -1;
  }
  else {
    if ((this->basic_statuses_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (this->basic_statuses_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pMVar5 = Basis::model(this_00);
      __n = (long)pMVar5->num_cols_ + (long)pMVar5->num_rows_;
      std::vector<int,_std::allocator<int>_>::vector(&local_48,__n,&local_49);
      if (0 < (int)__n) {
        lVar1 = *(long *)&(this_00->map2basis_).super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data;
        pdVar2 = (pMVar5->lb_)._M_data;
        pdVar3 = (pMVar5->ub_)._M_data;
        uVar6 = 0;
        do {
          if (*(int *)(lVar1 + uVar6 * 4) < 0) {
            if ((ulong)ABS(pdVar2[uVar6]) < 0x7ff0000000000000) {
              local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[uVar6] = -1;
            }
            else if ((ulong)ABS(pdVar3[uVar6]) < 0x7ff0000000000000) {
              local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[uVar6] = -2;
            }
            else {
              local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[uVar6] = -3;
            }
          }
          else {
            local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar6] = 0;
          }
          uVar6 = uVar6 + 1;
        } while ((__n & 0xffffffff) != uVar6);
      }
      Model::PostsolveBasis(&this->model_,&local_48,cbasis,vbasis);
      if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    else {
      Model::PostsolveBasis(&this->model_,&this->basic_statuses_,cbasis,vbasis);
    }
    IVar4 = 0;
  }
  return IVar4;
}

Assistant:

void LpSolver::ClearIPMStartingPoint() {
    x_start_.resize(0);
    xl_start_.resize(0);
    xu_start_.resize(0);
    y_start_.resize(0);
    zl_start_.resize(0);
    zu_start_.resize(0);
}